

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O2

string * __thiscall
wasm::ABI::getLegalizationPass_abi_cxx11_
          (string *__return_storage_ptr__,ABI *this,LegalizationLevel level)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((int)this == 0) {
    __s = "legalize-js-interface";
    __a = &local_12;
  }
  else {
    __s = "legalize-js-interface-minimally";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getLegalizationPass(LegalizationLevel level) {
  if (level == LegalizationLevel::Full) {
    return "legalize-js-interface";
  } else {
    return "legalize-js-interface-minimally";
  }
}